

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemmodeltester.cpp
# Opt level: O2

void __thiscall
QAbstractItemModelTesterPrivate::rowsInserted
          (QAbstractItemModelTesterPrivate *this,QModelIndex *parent,int start,int end)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QDebug *pQVar4;
  QVariant *variant;
  QObject *pQVar5;
  int iVar6;
  long in_FS_OFFSET;
  Changing c;
  QDebug local_140;
  anon_union_24_3_e3d07ef4_for_data local_138;
  undefined1 local_120 [24];
  QArrayDataPointer<char16_t> local_108;
  QDebug local_f0;
  QDebug local_e8;
  undefined1 local_e0 [8];
  QVariant local_d8;
  undefined1 local_b8 [32];
  anon_union_24_3_e3d07ef4_for_data local_98;
  undefined1 *puStack_80;
  anon_union_24_3_e3d07ef4_for_data local_78;
  undefined1 *puStack_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_b8._0_4_ = RowsInserted;
  bVar1 = compare<QAbstractItemModelTesterPrivate::ChangeInFlight,QAbstractItemModelTesterPrivate::ChangeInFlight>
                    (this,&this->changeInFlight,(ChangeInFlight *)local_b8,"changeInFlight",
                     "ChangeInFlight::RowsInserted",
                     "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                     ,0x348);
  if (!bVar1) goto LAB_00142ff8;
  this->changeInFlight = None;
  lcModelTest();
  if (((byte)lcModelTest::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_b8._0_4_ = ColumnsMoved;
    local_b8._4_4_ = 0;
    local_b8._8_4_ = 0;
    local_b8._12_4_ = 0;
    local_b8._16_4_ = 0;
    local_b8._20_4_ = 0;
    local_b8._24_8_ = lcModelTest::category.name;
    QMessageLogger::debug();
    pQVar4 = QDebug::operator<<((QDebug *)local_120,"rowsInserted");
    pQVar4 = QDebug::operator<<(pQVar4,"start=");
    pQVar4 = QDebug::operator<<(pQVar4,start);
    pQVar4 = QDebug::operator<<(pQVar4,"end=");
    pQVar4 = QDebug::operator<<(pQVar4,end);
    pQVar4 = QDebug::operator<<(pQVar4,"parent=");
    local_e0 = (undefined1  [8])pQVar4->stream;
    *(int *)((long)local_e0 + 0x28) = *(int *)((long)local_e0 + 0x28) + 1;
    operator<<((Stream *)(local_120 + 0x18),(QModelIndex *)local_e0);
    pQVar4 = QDebug::operator<<((QDebug *)(local_120 + 0x18),"parent data=");
    pQVar5 = (this->model).wp.value;
    (**(code **)(*(long *)pQVar5 + 0x90))(&local_58,pQVar5,parent,0);
    QVariant::toString();
    pQVar4 = QDebug::operator<<(pQVar4,(QString *)&local_d8);
    pQVar4 = QDebug::operator<<(pQVar4,"current count of parent=");
    pQVar5 = (this->model).wp.value;
    iVar2 = (**(code **)(*(long *)pQVar5 + 0x78))(pQVar5,parent);
    QDebug::operator<<(pQVar4,iVar2);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_d8);
    QVariant::~QVariant((QVariant *)&local_58);
    QDebug::~QDebug((QDebug *)(local_120 + 0x18));
    QDebug::~QDebug((QDebug *)local_e0);
    QDebug::~QDebug((QDebug *)local_120);
  }
  for (iVar2 = start; iVar2 <= end; iVar2 = iVar2 + 1) {
    lcModelTest();
    if (((byte)lcModelTest::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
      local_b8._0_4_ = ColumnsMoved;
      local_b8._4_4_ = 0;
      local_b8._8_4_ = 0;
      local_b8._12_4_ = 0;
      local_b8._16_4_ = 0;
      local_b8._20_4_ = 0;
      local_b8._24_8_ = lcModelTest::category.name;
      QMessageLogger::debug();
      pQVar4 = QDebug::operator<<((QDebug *)(local_120 + 0x18),"    itemWasInserted:");
      variant = (QVariant *)QDebug::operator<<(pQVar4,iVar2);
      pQVar5 = (this->model).wp.value;
      (**(code **)(*(long *)pQVar5 + 0x60))((QModelIndex *)&local_d8,pQVar5,iVar2,0,parent);
      QModelIndex::data((QVariant *)&local_58,(QModelIndex *)&local_d8,0);
      operator<<(&local_e8,variant);
      QDebug::~QDebug(&local_e8);
      QVariant::~QVariant((QVariant *)&local_58);
      QDebug::~QDebug((QDebug *)(local_120 + 0x18));
    }
  }
  local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  local_98.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_b8._16_4_ = 0xaaaaaaaa;
  local_b8._20_4_ = 0xaaaaaaaa;
  local_b8._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_b8._0_4_ = 0xaaaaaaaa;
  local_b8._4_4_ = -0x55555556;
  local_b8._8_4_ = 0xaaaaaaaa;
  local_b8._12_4_ = 0xaaaaaaaa;
  QList<QAbstractItemModelTesterPrivate::Changing>::takeLast
            ((value_type *)local_b8,
             &(this->insert).super_QList<QAbstractItemModelTesterPrivate::Changing>);
  bVar1 = compare<QModelIndex,QModelIndex>
                    (this,parent,(QModelIndex *)local_b8,"parent","c.parent",
                     "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                     ,0x357);
  if (bVar1) {
    pQVar5 = (this->model).wp.value;
    local_58._0_4_ = (**(code **)(*(long *)pQVar5 + 0x78))(pQVar5,parent);
    local_d8.d.data._0_4_ = local_b8._24_4_ + (end - start) + 1;
    bVar1 = compare<int,int>(this,(int *)local_58.data,(int *)&local_d8,"model->rowCount(parent)",
                             "c.oldSize + (end - start + 1)",
                             "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                             ,0x359);
    if (bVar1) {
      if (0 < start) {
        iVar2 = (((this->model).wp.d)->strongref)._q_value.super___atomic_base<int>._M_i;
        pQVar5 = (this->model).wp.value;
        (**(code **)(*(long *)pQVar5 + 0x60))(&local_d8,pQVar5,start + -1,0,local_b8);
        if (iVar2 == 0) {
          pQVar5 = (QObject *)0x0;
        }
        (**(code **)(*(long *)pQVar5 + 0x90))(&local_58,pQVar5,&local_d8,0);
        bVar1 = compare<QVariant,QVariant>
                          (this,(QVariant *)&local_58,(QVariant *)&local_98,
                           "model->data(model->index(start - 1, 0, c.parent))","c.last",
                           "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                           ,0x35b);
        QVariant::~QVariant((QVariant *)&local_58);
        if (!bVar1) goto LAB_00142feb;
      }
      pQVar5 = (this->model).wp.value;
      iVar2 = (**(code **)(*(long *)pQVar5 + 0x78))(pQVar5,local_b8);
      iVar6 = end + 1;
      if (iVar6 < iVar2) {
        iVar2 = (((this->model).wp.d)->strongref)._q_value.super___atomic_base<int>._M_i;
        pQVar5 = (this->model).wp.value;
        (**(code **)(*(long *)pQVar5 + 0x60))(&local_d8,pQVar5,iVar6,0,local_b8);
        if (iVar2 == 0) {
          pQVar5 = (QObject *)0x0;
        }
        (**(code **)(*(long *)pQVar5 + 0x90))(&local_58,pQVar5,&local_d8,0);
        bVar1 = operator!=((QVariant *)&local_78,(QVariant *)&local_58);
        QVariant::~QVariant((QVariant *)&local_58);
        if (bVar1) {
          local_58._0_4_ = 2;
          local_58._20_4_ = 0;
          local_58._4_4_ = 0;
          local_58._8_4_ = 0;
          local_58._12_4_ = 0;
          local_58._16_4_ = 0;
          local_40 = "default";
          QMessageLogger::debug();
          pQVar4 = QDebug::operator<<((QDebug *)&local_d8,start);
          QDebug::operator<<(pQVar4,end);
          QDebug::~QDebug((QDebug *)&local_d8);
          iVar2 = 0;
          while( true ) {
            pQVar5 = (this->model).wp.value;
            local_58._0_4_ = 0xffffffff;
            local_58._4_4_ = 0xffffffff;
            local_58._8_4_ = 0;
            local_58._12_4_ = 0;
            local_58._16_4_ = 0;
            local_58._20_4_ = 0;
            iVar3 = (**(code **)(*(long *)pQVar5 + 0x78))(pQVar5,&local_58);
            if (iVar3 <= iVar2) break;
            local_58._0_4_ = 2;
            local_58._4_4_ = 0;
            local_58._8_4_ = 0;
            local_58._12_4_ = 0;
            local_58._16_4_ = 0;
            local_58._20_4_ = 0;
            local_40 = "default";
            QMessageLogger::debug();
            pQVar5 = (this->model).wp.value;
            local_138._forAlignment = -NAN;
            local_138._8_8_ = 0;
            local_138._16_8_ = 0;
            (**(code **)(*(long *)pQVar5 + 0x60))
                      ((QModelIndex *)local_120,pQVar5,iVar2,0,&local_138);
            QModelIndex::data(&local_d8,(QModelIndex *)local_120,0);
            QVariant::toString();
            QDebug::operator<<(&local_f0,(QString *)(local_120 + 0x18));
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)(local_120 + 0x18));
            QVariant::~QVariant(&local_d8);
            QDebug::~QDebug(&local_f0);
            iVar2 = iVar2 + 1;
          }
          local_58._0_4_ = 2;
          local_58._4_4_ = 0;
          local_58._8_4_ = 0;
          local_58._12_4_ = 0;
          local_58._16_4_ = 0;
          local_58._20_4_ = 0;
          local_40 = "default";
          QMessageLogger::debug();
          operator<<((QDebug *)local_120,(QVariant *)&local_138);
          iVar2 = (((this->model).wp.d)->strongref)._q_value.super___atomic_base<int>._M_i;
          pQVar5 = (this->model).wp.value;
          (**(code **)(*(long *)pQVar5 + 0x60))(local_120 + 0x18,pQVar5,iVar6,0,local_b8);
          if (iVar2 == 0) {
            pQVar5 = (QObject *)0x0;
          }
          (**(code **)(*(long *)pQVar5 + 0x90))(&local_d8,pQVar5,local_120 + 0x18,0);
          operator<<(&local_140,(QVariant *)local_120);
          QDebug::~QDebug(&local_140);
          QVariant::~QVariant(&local_d8);
          QDebug::~QDebug((QDebug *)local_120);
          QDebug::~QDebug((QDebug *)&local_138.shared);
        }
        iVar2 = (((this->model).wp.d)->strongref)._q_value.super___atomic_base<int>._M_i;
        pQVar5 = (this->model).wp.value;
        (**(code **)(*(long *)pQVar5 + 0x60))(&local_d8,pQVar5,iVar6,0,local_b8);
        if (iVar2 == 0) {
          pQVar5 = (QObject *)0x0;
        }
        (**(code **)(*(long *)pQVar5 + 0x90))(&local_58,pQVar5,&local_d8,0);
        compare<QVariant,QVariant>
                  (this,(QVariant *)&local_58,(QVariant *)&local_78,
                   "model->data(model->index(end + 1, 0, c.parent))","c.next",
                   "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                   ,0x365);
        QVariant::~QVariant((QVariant *)&local_58);
      }
    }
  }
LAB_00142feb:
  Changing::~Changing((Changing *)local_b8);
LAB_00142ff8:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemModelTesterPrivate::rowsInserted(const QModelIndex &parent, int start, int end)
{
    MODELTESTER_COMPARE(changeInFlight, ChangeInFlight::RowsInserted);
    changeInFlight = ChangeInFlight::None;

    qCDebug(lcModelTest) << "rowsInserted"
                         << "start=" << start << "end=" << end << "parent=" << parent
                         << "parent data=" << model->data(parent).toString()
                         << "current count of parent=" << model->rowCount(parent);

    for (int i = start; i <= end; ++i) {
        qCDebug(lcModelTest) << "    itemWasInserted:" << i
                             << model->index(i, 0, parent).data();
    }


    Changing c = insert.pop();
    MODELTESTER_COMPARE(parent, c.parent);

    MODELTESTER_COMPARE(model->rowCount(parent), c.oldSize + (end - start + 1));
    if (start - 1 >= 0)
        MODELTESTER_COMPARE(model->data(model->index(start - 1, 0, c.parent)), c.last);

    if (end + 1 < model->rowCount(c.parent)) {
        if (c.next != model->data(model->index(end + 1, 0, c.parent))) {
            qDebug() << start << end;
            for (int i = 0; i < model->rowCount(); ++i)
                qDebug() << model->index(i, 0).data().toString();
            qDebug() << c.next << model->data(model->index(end + 1, 0, c.parent));
        }

        MODELTESTER_COMPARE(model->data(model->index(end + 1, 0, c.parent)), c.next);
    }
}